

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O1

bool __thiscall
glcts::ProgramUniformCase::setAndCompareUniforms
          (ProgramUniformCase *this,GLuint pipeline,GLuint programA,GLuint programB,DataType dType,
          int seed)

{
  glGetUniformuivFunc *pp_Var1;
  ostringstream *this_00;
  TestLog *pTVar2;
  Functions *gl;
  int iVar3;
  GLint GVar4;
  uint uVar5;
  undefined4 extraout_var;
  long *plVar6;
  ulong uVar7;
  undefined8 *puVar8;
  glGetUniformfvFunc *pp_Var9;
  TestError *pTVar10;
  int iVar11;
  long *plVar12;
  ulong *puVar13;
  long lVar14;
  int *location;
  long lVar15;
  glGetUniformfvFunc *pp_Var16;
  undefined4 in_register_00000084;
  float *pfVar17;
  long lVar18;
  glGetUniformivFunc *pp_Var19;
  float fVar20;
  GLuint activeProgram;
  string uniformBaseName;
  GLint locationA [12];
  uint udata [30];
  GLint locationB [12];
  ostringstream s;
  long *local_3b8;
  long local_3b0;
  long local_3a8;
  long lStack_3a0;
  undefined8 local_398;
  glGetUniformfvFunc *local_390;
  int local_384;
  long *local_380;
  undefined8 local_378;
  long local_370;
  undefined8 uStack_368;
  Functions *local_360;
  undefined8 local_358;
  GLuint local_34c;
  ulong *local_348;
  long local_340;
  ulong local_338 [2];
  long *local_328;
  long local_320;
  long local_318;
  long lStack_310;
  ulong *local_308;
  long local_300;
  ulong local_2f8;
  long lStack_2f0;
  long *local_2e8 [2];
  long local_2d8 [2];
  int local_2c8 [14];
  ulong local_290;
  long *local_288 [2];
  long local_278 [2];
  float local_268 [32];
  int local_1e8 [12];
  undefined1 local_1b8 [112];
  ios_base local_148 [8];
  ios_base local_140 [272];
  
  local_398 = CONCAT44(in_register_00000084,dType);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_360 = (Functions *)CONCAT44(extraout_var,iVar3);
  local_2e8[0] = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"uVal","");
  this_00 = (ostringstream *)(local_1b8 + 8);
  local_1b8._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(this_00);
  local_384 = seed;
  local_34c = pipeline;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Begin:ProgramUniformCase iterate",0x20);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  gl = local_360;
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_140);
  lVar18 = 0;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    std::ostream::operator<<((ostringstream *)local_1b8,(int)lVar18);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
    std::ios_base::~ios_base(local_148);
    plVar6 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_380,0,(char *)0x0,(ulong)local_2e8[0]);
    local_3b8 = &local_3a8;
    plVar12 = plVar6 + 2;
    if ((long *)*plVar6 == plVar12) {
      local_3a8 = *plVar12;
      lStack_3a0 = plVar6[3];
    }
    else {
      local_3a8 = *plVar12;
      local_3b8 = (long *)*plVar6;
    }
    local_3b0 = plVar6[1];
    *plVar6 = (long)plVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_380 != &local_370) {
      operator_delete(local_380,local_370 + 1);
    }
    GVar4 = (*gl->getUniformLocation)(programA,(GLchar *)local_3b8);
    local_2c8[lVar18] = GVar4;
    GVar4 = (*gl->getUniformLocation)(programB,(GLchar *)local_3b8);
    local_1e8[lVar18] = GVar4;
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,local_3a8 + 1);
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 4);
  local_390 = (glGetUniformfvFunc *)0x4;
  uVar7 = 0;
  do {
    local_358 = (glGetUniformfvFunc *)(CONCAT44(local_358._4_4_,(int)uVar7) | 4);
    iVar3 = 0;
    local_290 = uVar7;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::ostream::operator<<((ostringstream *)local_1b8,(int)local_358);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
      std::ios_base::~ios_base(local_148);
      plVar6 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_288,0,(char *)0x0,(ulong)local_2e8[0]);
      local_328 = &local_318;
      plVar12 = plVar6 + 2;
      if ((long *)*plVar6 == plVar12) {
        local_318 = *plVar12;
        lStack_310 = plVar6[3];
      }
      else {
        local_318 = *plVar12;
        local_328 = (long *)*plVar6;
      }
      local_320 = plVar6[1];
      *plVar6 = (long)plVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_328);
      puVar13 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar13) {
        local_2f8 = *puVar13;
        lStack_2f0 = plVar6[3];
        local_308 = &local_2f8;
      }
      else {
        local_2f8 = *puVar13;
        local_308 = (ulong *)*plVar6;
      }
      local_300 = plVar6[1];
      *plVar6 = (long)puVar13;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::ostream::operator<<((ostringstream *)local_1b8,iVar3);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
      std::ios_base::~ios_base(local_148);
      uVar7 = 0xf;
      if (local_308 != &local_2f8) {
        uVar7 = local_2f8;
      }
      if (uVar7 < (ulong)(local_340 + local_300)) {
        uVar7 = 0xf;
        if (local_348 != local_338) {
          uVar7 = local_338[0];
        }
        if (uVar7 < (ulong)(local_340 + local_300)) goto LAB_00bfa3fc;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_348,0,(char *)0x0,(ulong)local_308);
      }
      else {
LAB_00bfa3fc:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_348);
      }
      plVar6 = puVar8 + 2;
      if ((long *)*puVar8 == plVar6) {
        local_370 = *plVar6;
        uStack_368 = puVar8[3];
        local_380 = &local_370;
      }
      else {
        local_370 = *plVar6;
        local_380 = (long *)*puVar8;
      }
      local_378 = puVar8[1];
      *puVar8 = plVar6;
      puVar8[1] = 0;
      *(undefined1 *)plVar6 = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_380);
      plVar12 = plVar6 + 2;
      if ((long *)*plVar6 == plVar12) {
        local_3a8 = *plVar12;
        lStack_3a0 = plVar6[3];
        local_3b8 = &local_3a8;
      }
      else {
        local_3a8 = *plVar12;
        local_3b8 = (long *)*plVar6;
      }
      local_3b0 = plVar6[1];
      *plVar6 = (long)plVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_380 != &local_370) {
        operator_delete(local_380,local_370 + 1);
      }
      if (local_348 != local_338) {
        operator_delete(local_348,local_338[0] + 1);
      }
      if (local_308 != &local_2f8) {
        operator_delete(local_308,local_2f8 + 1);
      }
      if (local_328 != &local_318) {
        operator_delete(local_328,local_318 + 1);
      }
      if (local_288[0] != local_278) {
        operator_delete(local_288[0],local_278[0] + 1);
      }
      GVar4 = (*gl->getUniformLocation)(programA,(GLchar *)local_3b8);
      iVar11 = (int)local_390 + iVar3;
      local_2c8[iVar11] = GVar4;
      GVar4 = (*gl->getUniformLocation)(programB,(GLchar *)local_3b8);
      local_1e8[iVar11] = GVar4;
      if (local_3b8 != &local_3a8) {
        operator_delete(local_3b8,local_3a8 + 1);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 2);
    uVar5 = (int)local_290 + 1;
    uVar7 = (ulong)uVar5;
    local_390 = (glGetUniformfvFunc *)(ulong)((int)local_390 + 2);
  } while (uVar5 != 4);
  iVar3 = (int)local_398;
  if (iVar3 == 1) {
    lVar18 = 0;
    do {
      local_268[lVar18] = (float)(local_384 + (int)lVar18);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0x1e);
  }
  else {
    lVar18 = 0;
    do {
      local_268[lVar18] = (float)(local_384 + (int)lVar18);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0x1e);
  }
  if (iVar3 == 0x1b) {
    progUniformi(this,gl,programA,2,local_2c8,(int *)local_268);
  }
  else if (iVar3 == 0x1f) {
    progUniformui(this,gl,programA,2,local_2c8,(uint *)local_268);
  }
  else if (iVar3 == 1) {
    progUniformf(this,gl,programA,2,local_2c8,local_268);
  }
  local_390 = &local_360->getUniformfv;
  pp_Var1 = &local_360->getUniformuiv;
  pp_Var16 = (glGetUniformfvFunc *)&local_360->getUniformiv;
  pfVar17 = local_268;
  lVar18 = 0;
  local_358 = pp_Var16;
  do {
    pp_Var9 = local_390;
    iVar3 = (int)local_398;
    if (iVar3 == 0x1b) {
      (**pp_Var16)(programA,local_2c8[lVar18],(GLfloat *)local_1b8);
      pp_Var9 = pp_Var16;
LAB_00bfa762:
      (**pp_Var9)(programB,local_1e8[lVar18],(GLfloat *)&local_3b8);
    }
    else {
      if (iVar3 == 0x1f) {
        (**pp_Var1)(programA,local_2c8[lVar18],(GLfloat *)local_1b8);
        pp_Var9 = (glGetUniformfvFunc *)pp_Var1;
        goto LAB_00bfa762;
      }
      if (iVar3 == 1) {
        (**local_390)(programA,local_2c8[lVar18],(GLfloat *)local_1b8);
        pp_Var16 = local_358;
        goto LAB_00bfa762;
      }
    }
    iVar3 = (&DAT_01b36800)[lVar18];
    if (iVar3 < 2) {
      iVar3 = 1;
    }
    lVar14 = 0;
    lVar15 = 0;
    do {
      if ((*(float *)(local_1b8 + lVar15 * 4) != pfVar17[lVar15]) ||
         (*(float *)(local_1b8 + lVar15 * 4) == *(float *)((long)&local_3b8 + lVar15 * 4))) {
        pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar10,"ProgramUniformi failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                   ,0x5d7);
        __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + -4;
    } while (iVar3 != (int)lVar15);
    lVar18 = lVar18 + 1;
    pfVar17 = (float *)((long)pfVar17 - lVar14);
  } while (lVar18 != 0xc);
  iVar3 = (int)local_398;
  if (iVar3 == 1) {
    fVar20 = local_268[0x1d] + 1.0;
    local_268[0] = fVar20;
    lVar18 = 1;
    do {
      fVar20 = fVar20 + 1.0;
      local_268[lVar18] = fVar20;
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0x1e);
  }
  else {
    local_268[0] = (float)((int)local_268[0x1d] + 1);
    iVar11 = (int)local_268[0x1d] + 2;
    lVar18 = 0;
    do {
      local_268[lVar18 + 1] = (float)(iVar11 + (int)lVar18);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0x1d);
  }
  if (iVar3 == 0x1b) {
    progUniformi(this,gl,programB,2,local_1e8,(int *)local_268);
  }
  else if (iVar3 == 0x1f) {
    progUniformui(this,gl,programB,2,local_1e8,(uint *)local_268);
  }
  else if (iVar3 == 1) {
    progUniformf(this,gl,programB,2,local_1e8,local_268);
  }
  local_390 = &local_360->getUniformfv;
  pp_Var1 = &local_360->getUniformuiv;
  pp_Var19 = &local_360->getUniformiv;
  pfVar17 = local_268;
  lVar18 = 0;
  do {
    pp_Var16 = local_390;
    iVar3 = (int)local_398;
    if (iVar3 == 0x1b) {
      (**pp_Var19)(programA,local_2c8[lVar18],(GLfloat *)local_1b8);
      pp_Var16 = (glGetUniformfvFunc *)pp_Var19;
LAB_00bfa94c:
      (**pp_Var16)(programB,local_1e8[lVar18],(GLfloat *)&local_3b8);
    }
    else {
      if (iVar3 == 0x1f) {
        (**pp_Var1)(programA,local_2c8[lVar18],(GLfloat *)local_1b8);
        pp_Var16 = (glGetUniformfvFunc *)pp_Var1;
        goto LAB_00bfa94c;
      }
      if (iVar3 == 1) {
        (**local_390)(programA,local_2c8[lVar18],(GLfloat *)local_1b8);
        goto LAB_00bfa94c;
      }
    }
    iVar3 = (&DAT_01b36800)[lVar18];
    if (iVar3 < 2) {
      iVar3 = 1;
    }
    lVar14 = 0;
    lVar15 = 0;
    do {
      fVar20 = *(float *)((long)&local_3b8 + lVar15 * 4);
      if ((fVar20 != pfVar17[lVar15]) || (*(float *)(local_1b8 + lVar15 * 4) == fVar20)) {
        pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar10,"ProgramUniformi failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                   ,0x619);
        __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + -4;
    } while (iVar3 != (int)lVar15);
    lVar18 = lVar18 + 1;
    pfVar17 = (float *)((long)pfVar17 - lVar14);
    if (lVar18 == 0xc) {
      local_3b8 = (long *)((ulong)local_3b8 & 0xffffffff00000000);
      if (local_34c != 0) {
        (*gl->getProgramPipelineiv)(local_34c,0x8259,(GLint *)&local_3b8);
      }
      if (((GLuint)local_3b8 != 0) &&
         ((GLuint)local_3b8 == programA || (GLuint)local_3b8 == programB)) {
        location = local_1e8;
        if ((GLuint)local_3b8 == programA) {
          location = local_2c8;
        }
        iVar3 = (int)local_398;
        if (iVar3 == 1) {
          fVar20 = local_268[0x1d] + 1.0;
          local_268[0] = fVar20;
          lVar18 = 1;
          do {
            fVar20 = fVar20 + 1.0;
            local_268[lVar18] = fVar20;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 0x1e);
        }
        else {
          local_268[0] = (float)((int)local_268[0x1d] + 1);
          lVar18 = 0;
          do {
            local_268[lVar18 + 1] = (float)((int)local_268[0x1d] + 2 + (int)lVar18);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 0x1d);
        }
        if (iVar3 == 0x1b) {
          activeUniformi(this,gl,2,location,(int *)local_268);
        }
        else if (iVar3 == 0x1f) {
          activeUniformui(this,gl,2,location,(uint *)local_268);
        }
        else if (iVar3 == 1) {
          activeUniformf(this,gl,2,location,local_268);
        }
        pfVar17 = local_268;
        lVar18 = 0;
        do {
          uVar5 = (uint)local_398;
          lVar14 = (ulong)(uVar5 != 0x1b) * 8 + 0xb68;
          if ((iVar3 - 0x1bU & 0xfffffffb) != 0) {
            lVar14 = 0xb60;
          }
          if ((uVar5 < 0x20) && ((0x88000002U >> (uVar5 & 0x1f) & 1) != 0)) {
            (**(code **)((long)&gl->activeShaderProgram + lVar14))
                      ((ulong)local_3b8 & 0xffffffff,location[lVar18],local_1b8);
          }
          iVar11 = (&DAT_01b36800)[lVar18];
          if (iVar11 < 2) {
            iVar11 = 1;
          }
          lVar14 = 0;
          lVar15 = 0;
          do {
            if (*(float *)(local_1b8 + lVar15 * 4) != pfVar17[lVar15]) {
              pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar10,"ActiveShaderProgram failed",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                         ,0x663);
              __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
            lVar15 = lVar15 + 1;
            lVar14 = lVar14 + -4;
          } while (iVar11 != (int)lVar15);
          lVar18 = lVar18 + 1;
          pfVar17 = (float *)((long)pfVar17 - lVar14);
        } while (lVar18 != 0xc);
      }
      if (local_2e8[0] != local_2d8) {
        operator_delete(local_2e8[0],local_2d8[0] + 1);
      }
      return true;
    }
  } while( true );
}

Assistant:

bool setAndCompareUniforms(glw::GLuint pipeline, glw::GLuint programA, glw::GLuint programB, glu::DataType dType,
							   int seed)
	{
		TestLog&			  log = m_testCtx.getLog();
		const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
		// The fragment shader has defined uniforms of type:
		// scalar, vec2, vec3, vec4, and then length 2 arrays of
		// scalar, vec2, vec3, and vec4.
		// 4 uniforms in array form and 4 not in arrays.
		// We query a total of 12 uniform locations
		const int nonarrayUnifCount = 4;
		const int arrayUnifCount	= 4;
		const int arraySize			= 2;
		const int locationCount		= nonarrayUnifCount + arraySize * arrayUnifCount;
		// dwordCount represents the number of dwords to compare for each uniform location
		// scalar, vec2, vec3, vec4, scalar[0], scalar[1], vec2[0], vec2[1], etc.
		const int  dwordCount[locationCount] = { 1, 2, 3, 4, 1, 1, 2, 2, 3, 3, 4, 4 };
		glw::GLint locationA[locationCount];
		glw::GLint locationB[locationCount];
		// The total amount of data the uniforms take up: 1+2+3+4 + 2*(1+2+3+4)
		const int	udataCount = 30;
		unsigned int udata[udataCount]; //
		int*		 data  = (int*)&udata[0];
		float*		 fdata = (float*)&udata[0];
		int			 i, j, k;
		std::string  uniformBaseName("uVal");

		// ProgramUniform API verification
		log << TestLog::Message << "Begin:ProgramUniformCase iterate" << TestLog::EndMessage;

		// get uniform locations
		// scalar and vec uniforms
		for (i = 0; i < nonarrayUnifCount; i++)
		{
			string name  = uniformBaseName + de::toString(i);
			locationA[i] = gl.getUniformLocation(programA, name.c_str());
			locationB[i] = gl.getUniformLocation(programB, name.c_str());
		}
		// uniform arrays
		for (j = 0; j < arrayUnifCount; j++)
		{
			for (k = 0; k < arraySize; k++)
			{
				string name  = uniformBaseName + de::toString(nonarrayUnifCount + j) + "[" + de::toString(k) + "]";
				locationA[i] = gl.getUniformLocation(programA, name.c_str());
				locationB[i] = gl.getUniformLocation(programB, name.c_str());
				i++;
			}
		}

		// seed data buffer with unique values
		if (dType == glu::TYPE_FLOAT)
		{
			for (i = 0; i < udataCount; i++)
			{
				fdata[i] = (float)(seed + i);
			}
		}
		else
		{
			for (i = 0; i < udataCount; i++)
			{
				data[i] = seed + i;
			}
		}

		// set uniforms in program A
		if (dType == glu::TYPE_INT)
		{
			progUniformi(gl, programA, arraySize, locationA, data);
		}
		else if (dType == glu::TYPE_UINT)
		{
			progUniformui(gl, programA, arraySize, locationA, udata);
		}
		else if (dType == glu::TYPE_FLOAT)
		{
			progUniformf(gl, programA, arraySize, locationA, fdata);
		}

		// get and compare uniforms
		unsigned int* uValue = &udata[0];
		for (i = 0; i < nonarrayUnifCount + arraySize * arrayUnifCount; i++)
		{
			unsigned int retValA[4], retValB[4];

			if (dType == glu::TYPE_INT)
			{
				gl.getUniformiv(programA, locationA[i], (int*)&retValA[0]);
				gl.getUniformiv(programB, locationB[i], (int*)&retValB[0]);
			}
			else if (dType == glu::TYPE_UINT)
			{
				gl.getUniformuiv(programA, locationA[i], &retValA[0]);
				gl.getUniformuiv(programB, locationB[i], &retValB[0]);
			}
			else if (dType == glu::TYPE_FLOAT)
			{
				gl.getUniformfv(programA, locationA[i], (float*)&retValA[0]);
				gl.getUniformfv(programB, locationB[i], (float*)&retValB[0]);
			}

			for (j = 0; j < dwordCount[i]; j++)
			{
				// Compare programA uniform to expected value and
				// test to see if programB picked up the value.
				if ((retValA[j] != *uValue++) || (retValA[j] == retValB[j]))
				{
					TCU_FAIL("ProgramUniformi failed");
				}
			}
		}

		// reseed data buffer, continuing to increment
		if (dType == glu::TYPE_FLOAT)
		{
			fdata[0] = fdata[udataCount - 1] + 1.0f;
			for (i = 1; i < udataCount; i++)
			{
				fdata[i] = fdata[i - 1] + 1.0f;
			}
		}
		else
		{
			data[0] = data[udataCount - 1] + 1;
			for (i = 1; i < udataCount; i++)
			{
				data[i] = data[i - 1] + 1;
			}
		}

		// set uniforms in program B

		if (dType == glu::TYPE_INT)
		{
			progUniformi(gl, programB, arraySize, locationB, data);
		}
		else if (dType == glu::TYPE_UINT)
		{
			progUniformui(gl, programB, arraySize, locationB, udata);
		}
		else if (dType == glu::TYPE_FLOAT)
		{
			progUniformf(gl, programB, arraySize, locationB, fdata);
		}

		// get and compare uniforms
		uValue = &udata[0];
		for (i = 0; i < nonarrayUnifCount + arraySize * arrayUnifCount; i++)
		{
			unsigned int retValA[4], retValB[4];

			if (dType == glu::TYPE_INT)
			{
				gl.getUniformiv(programA, locationA[i], (int*)&retValA[0]);
				gl.getUniformiv(programB, locationB[i], (int*)&retValB[0]);
			}
			else if (dType == glu::TYPE_UINT)
			{
				gl.getUniformuiv(programA, locationA[i], &retValA[0]);
				gl.getUniformuiv(programB, locationB[i], &retValB[0]);
			}
			else if (dType == glu::TYPE_FLOAT)
			{
				gl.getUniformfv(programA, locationA[i], (float*)&retValA[0]);
				gl.getUniformfv(programB, locationB[i], (float*)&retValB[0]);
			}

			for (j = 0; j < dwordCount[i]; j++)
			{
				// Compare programB uniform to expected value and
				// test to see if programA picked up the value.
				if ((retValB[j] != *uValue++) || (retValA[j] == retValB[j]))
				{
					TCU_FAIL("ProgramUniformi failed");
				}
			}
		}

		// Test the conventional uniform interfaces on an ACTIVE_PROGRAM
		glw::GLuint activeProgram = 0;
		if (pipeline != 0)
		{
			gl.getProgramPipelineiv(pipeline, GL_ACTIVE_PROGRAM, (int*)&activeProgram);
		}
		if ((activeProgram != 0) && ((activeProgram == programA) || (activeProgram == programB)))
		{
			glw::GLint* location;

			location = (activeProgram == programA) ? locationA : locationB;

			// reseed data buffer, continuing to increment
			if (dType == glu::TYPE_FLOAT)
			{
				fdata[0] = fdata[udataCount - 1] + 1.0f;
				for (i = 1; i < udataCount; i++)
				{
					fdata[i] = fdata[i - 1] + 1.0f;
				}
			}
			else
			{
				data[0] = data[udataCount - 1] + 1;
				for (i = 1; i < udataCount; i++)
				{
					data[i] = data[i - 1] + 1;
				}
			}

			// set uniforms using original glUniform*

			if (dType == glu::TYPE_INT)
			{
				activeUniformi(gl, arraySize, location, data);
			}
			else if (dType == glu::TYPE_UINT)
			{
				activeUniformui(gl, arraySize, location, udata);
			}
			else if (dType == glu::TYPE_FLOAT)
			{
				activeUniformf(gl, arraySize, location, fdata);
			}

			// get and compare uniforms
			uValue = &udata[0];
			for (i = 0; i < nonarrayUnifCount + arraySize * arrayUnifCount; i++)
			{
				unsigned int retVal[4];

				if (dType == glu::TYPE_INT)
				{
					gl.getUniformiv(activeProgram, location[i], (int*)&retVal[0]);
				}
				else if (dType == glu::TYPE_UINT)
				{
					gl.getUniformuiv(activeProgram, location[i], &retVal[0]);
				}
				else if (dType == glu::TYPE_FLOAT)
				{
					gl.getUniformfv(activeProgram, location[i], (float*)&retVal[0]);
				}

				for (j = 0; j < dwordCount[i]; j++)
				{
					// Compare activeProgram uniform to expected value
					if ((retVal[j] != *uValue++))
					{
						TCU_FAIL("ActiveShaderProgram failed");
					}
				}
			}
		}

		return true;
	}